

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_tree(char *args)

{
  size_t sVar1;
  char *__s;
  int total_file_count;
  int total_dir_count;
  uint local_20;
  uint local_1c;
  
  local_1c = 0;
  local_20 = 0;
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar1 = strlen(__s);
    args[sVar1] = '\0';
  }
  cmd_tree_recursive("",__s,__s,0,(int *)&local_1c,(int *)&local_20);
  printf("\n%d directories, %d files\n",(ulong)local_1c,(ulong)local_20);
  return 1;
}

Assistant:

static int cmd_tree(char *args)
{
    int total_dir_count = 0, total_file_count = 0; /* FIXME: should be PHYSFS_uint64 */

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    cmd_tree_recursive("", args, args, 0, &total_dir_count, &total_file_count);

    printf("\n%d directories, %d files\n", total_dir_count, total_file_count);
    return 1;
}